

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O0

bool __thiscall sf::priv::RenderTextureImplFBO::createFrameBuffer(RenderTextureImplFBO *this)

{
  ostream *poVar1;
  long in_RDI;
  pair<unsigned_long_long,_unsigned_int> pVar2;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long_long,_unsigned_int>_>::value,_pair<iterator,_bool>_>
  _Var3;
  char *in_stack_00000020;
  uint in_stack_0000002c;
  char *in_stack_00000030;
  Lock lock_1;
  GLuint multisampleFrameBuffer;
  Lock lock;
  GLenum status;
  GLuint frameBuffer;
  uint *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  pair<unsigned_long_long,_unsigned_int> *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  GLuint local_6c;
  _Base_ptr local_68;
  undefined1 local_60;
  unsigned_long_long local_58;
  uint local_50;
  GLuint local_48;
  Uint64 local_38;
  unsigned_long_long local_30;
  uint local_28;
  GLenum local_18;
  GLuint local_14 [4];
  bool local_1;
  
  local_14[0] = 0;
  (*sf_ptrc_glGenFramebuffersEXT)(1,local_14);
  glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  if (local_14[0] == 0) {
    poVar1 = err();
    poVar1 = std::operator<<(poVar1,
                             "Impossible to create render texture (failed to create the frame buffer object)"
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  else {
    (*sf_ptrc_glBindFramebufferEXT)(0x8d40,local_14[0]);
    glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
    if (((*(byte *)(in_RDI + 0x84) & 1) == 0) && (*(int *)(in_RDI + 0x68) != 0)) {
      (*sf_ptrc_glFramebufferRenderbufferEXT)(0x8d40,0x8d00,0x8d41,*(GLuint *)(in_RDI + 0x68));
      glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
      if ((*(byte *)(in_RDI + 0x85) & 1) != 0) {
        (*sf_ptrc_glFramebufferRenderbufferEXT)(0x8d40,0x8d20,0x8d41,*(GLuint *)(in_RDI + 0x68));
        glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
      }
    }
    (*sf_ptrc_glFramebufferTexture2DEXT)(0x8d40,0x8ce0,0xde1,*(GLuint *)(in_RDI + 0x80),0);
    glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
    local_18 = (*sf_ptrc_glCheckFramebufferStatusEXT)(0x8d40);
    glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
    if (local_18 == 0x8cd5) {
      Lock::Lock((Lock *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (Mutex *)in_stack_fffffffffffffee8);
      local_38 = Context::getActiveContextId();
      local_48 = local_14[0];
      pVar2 = std::make_pair<unsigned_long_long,unsigned_int>
                        ((unsigned_long_long *)
                         CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffed8);
      local_58 = pVar2.first;
      local_50 = pVar2.second;
      local_30 = local_58;
      local_28 = local_50;
      _Var3 = std::
              map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>
              ::insert<std::pair<unsigned_long_long,unsigned_int>>
                        ((map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
                          *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8);
      local_68 = (_Base_ptr)_Var3.first._M_node;
      local_60 = _Var3.second;
      Lock::~Lock((Lock *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
      if ((*(byte *)(in_RDI + 0x84) & 1) != 0) {
        local_6c = 0;
        (*sf_ptrc_glGenFramebuffersEXT)(1,&local_6c);
        glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
        if (local_6c == 0) {
          poVar1 = err();
          poVar1 = std::operator<<(poVar1,
                                   "Impossible to create render texture (failed to create the multisample frame buffer object)"
                                  );
          std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
          return false;
        }
        (*sf_ptrc_glBindFramebufferEXT)(0x8d40,local_6c);
        glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
        (*sf_ptrc_glBindRenderbufferEXT)(0x8d41,*(GLuint *)(in_RDI + 0x6c));
        glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
        (*sf_ptrc_glFramebufferRenderbufferEXT)(0x8d40,0x8ce0,0x8d41,*(GLuint *)(in_RDI + 0x6c));
        glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
        if (*(int *)(in_RDI + 0x68) != 0) {
          (*sf_ptrc_glFramebufferRenderbufferEXT)(0x8d40,0x8d00,0x8d41,*(GLuint *)(in_RDI + 0x68));
          glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
          if ((*(byte *)(in_RDI + 0x85) & 1) != 0) {
            (*sf_ptrc_glFramebufferRenderbufferEXT)(0x8d40,0x8d20,0x8d41,*(GLuint *)(in_RDI + 0x68))
            ;
            glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
          }
        }
        local_18 = (*sf_ptrc_glCheckFramebufferStatusEXT)(0x8d40);
        glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
        if (local_18 != 0x8cd5) {
          (*sf_ptrc_glBindFramebufferEXT)(0x8d40,0);
          glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
          (*sf_ptrc_glDeleteFramebuffersEXT)(1,&local_6c);
          glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
          poVar1 = err();
          poVar1 = std::operator<<(poVar1,
                                   "Impossible to create render texture (failed to link the render buffers to the multisample frame buffer)"
                                  );
          std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
          return false;
        }
        Lock::Lock((Lock *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (Mutex *)in_stack_fffffffffffffee8);
        Context::getActiveContextId();
        pVar2 = std::make_pair<unsigned_long_long,unsigned_int>
                          ((unsigned_long_long *)
                           CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffed8);
        _Var3 = std::
                map<unsigned_long_long,unsigned_int,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_int>>>
                ::insert<std::pair<unsigned_long_long,unsigned_int>>
                          ((map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
                            *)CONCAT44(pVar2.second,in_stack_fffffffffffffef0),
                           in_stack_fffffffffffffee8);
        Lock::~Lock((Lock *)CONCAT17(_Var3.second,in_stack_fffffffffffffee0));
      }
      local_1 = true;
    }
    else {
      (*sf_ptrc_glBindFramebufferEXT)(0x8d40,0);
      glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
      (*sf_ptrc_glDeleteFramebuffersEXT)(1,local_14);
      glCheckError(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
      poVar1 = err();
      poVar1 = std::operator<<(poVar1,
                               "Impossible to create render texture (failed to link the target texture to the frame buffer)"
                              );
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool RenderTextureImplFBO::createFrameBuffer()
{
    // Create the framebuffer object
    GLuint frameBuffer = 0;
    glCheck(GLEXT_glGenFramebuffers(1, &frameBuffer));

    if (!frameBuffer)
    {
        err() << "Impossible to create render texture (failed to create the frame buffer object)" << std::endl;
        return false;
    }
    glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, frameBuffer));

    // Link the depth/stencil renderbuffer to the frame buffer
    if (!m_multisample && m_depthStencilBuffer)
    {
        glCheck(GLEXT_glFramebufferRenderbuffer(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_DEPTH_ATTACHMENT, GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));

#ifndef SFML_OPENGL_ES

        if (m_stencil)
        {
            glCheck(GLEXT_glFramebufferRenderbuffer(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_STENCIL_ATTACHMENT, GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
        }

#endif

    }

    // Link the texture to the frame buffer
    glCheck(GLEXT_glFramebufferTexture2D(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_textureId, 0));

    // A final check, just to be sure...
    GLenum status;
    glCheck(status = GLEXT_glCheckFramebufferStatus(GLEXT_GL_FRAMEBUFFER));
    if (status != GLEXT_GL_FRAMEBUFFER_COMPLETE)
    {
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, 0));
        glCheck(GLEXT_glDeleteFramebuffers(1, &frameBuffer));
        err() << "Impossible to create render texture (failed to link the target texture to the frame buffer)" << std::endl;
        return false;
    }

    {
        Lock lock(mutex);

        // Insert the FBO into our map
        m_frameBuffers.insert(std::make_pair(Context::getActiveContextId(), static_cast<unsigned int>(frameBuffer)));
    }

#ifndef SFML_OPENGL_ES

    if (m_multisample)
    {
        // Create the multisample framebuffer object
        GLuint multisampleFrameBuffer = 0;
        glCheck(GLEXT_glGenFramebuffers(1, &multisampleFrameBuffer));

        if (!multisampleFrameBuffer)
        {
            err() << "Impossible to create render texture (failed to create the multisample frame buffer object)" << std::endl;
            return false;
        }
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, multisampleFrameBuffer));

        // Link the multisample color buffer to the frame buffer
        glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_colorBuffer));
        glCheck(GLEXT_glFramebufferRenderbuffer(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GLEXT_GL_RENDERBUFFER, m_colorBuffer));

        // Link the depth/stencil renderbuffer to the frame buffer
        if (m_depthStencilBuffer)
        {
            glCheck(GLEXT_glFramebufferRenderbuffer(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_DEPTH_ATTACHMENT, GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));

            if (m_stencil)
            {
                glCheck(GLEXT_glFramebufferRenderbuffer(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_STENCIL_ATTACHMENT, GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
            }
        }

        // A final check, just to be sure...
        glCheck(status = GLEXT_glCheckFramebufferStatus(GLEXT_GL_FRAMEBUFFER));
        if (status != GLEXT_GL_FRAMEBUFFER_COMPLETE)
        {
            glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, 0));
            glCheck(GLEXT_glDeleteFramebuffers(1, &multisampleFrameBuffer));
            err() << "Impossible to create render texture (failed to link the render buffers to the multisample frame buffer)" << std::endl;
            return false;
        }

        {
            Lock lock(mutex);

            // Insert the FBO into our map
            m_multisampleFrameBuffers.insert(std::make_pair(Context::getActiveContextId(), static_cast<unsigned int>(multisampleFrameBuffer)));
        }
    }

#endif

    return true;
}